

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

void __thiscall
soul::HTMLGenerator::printLibrary(HTMLGenerator *this,HTMLElement *parent,File *library)

{
  pointer pMVar1;
  HTMLElement *pHVar2;
  HTMLElement *pHVar3;
  undefined1 in_R8B;
  Module *m;
  pointer m_00;
  string_view className;
  string_view value;
  string_view text;
  string_view className_00;
  string_view text_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48;
  
  className._M_str = "library";
  className._M_len = 7;
  pHVar2 = choc::html::HTMLElement::addDiv(parent,className);
  value._M_str = (library->UID)._M_dataplus._M_p;
  value._M_len = (library->UID)._M_string_length;
  pHVar2 = choc::html::HTMLElement::setID(pHVar2,value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"h1",(allocator<char> *)&local_60);
  pHVar3 = choc::html::HTMLElement::addChild(pHVar2,&local_48);
  text._M_str = (library->title)._M_dataplus._M_p;
  text._M_len = (library->title)._M_string_length;
  choc::html::HTMLElement::addContent(pHVar3,text);
  std::__cxx11::string::~string((string *)&local_48);
  if ((library->summary)._M_string_length != 0) {
    className_00._M_str = "summary";
    className_00._M_len = 7;
    pHVar3 = choc::html::HTMLElement::addDiv(pHVar2,className_00);
    text_00._M_str = (char *)0x0;
    text_00._M_len = (size_t)(library->summary)._M_dataplus._M_p;
    choc::text::splitIntoLines_abi_cxx11_
              (&local_60,(text *)(library->summary)._M_string_length,text_00,(bool)in_R8B);
    addMarkdownAsHTML(pHVar3,&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
  }
  pMVar1 = (library->modules).
           super__Vector_base<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (m_00 = (library->modules).
              super__Vector_base<soul::SourceCodeModel::Module,_std::allocator<soul::SourceCodeModel::Module>_>
              ._M_impl.super__Vector_impl_data._M_start; m_00 != pMVar1; m_00 = m_00 + 1) {
    printModule(this,pHVar2,m_00);
  }
  return;
}

Assistant:

void printLibrary (choc::html::HTMLElement& parent, const SourceCodeModel::File& library)
    {
        auto& libraryDiv = parent.addDiv ("library").setID (library.UID);

        libraryDiv.addChild ("h1").addContent (library.title);

        if (! library.summary.empty())
            addMarkdownAsHTML (libraryDiv.addDiv ("summary"),
                               choc::text::splitIntoLines (library.summary, false));

        for (auto& m : library.modules)
            printModule (libraryDiv, m);
    }